

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rb_aug.c
# Opt level: O3

wtree_node_t * wtree_walk_next(wtree_walk *it,int dir,wtree_node_t **r_left,wtree_node_t **r_right)

{
  int *piVar1;
  wtree_node_t *pwVar2;
  int iVar3;
  wtree_node *pwVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  wtree_node_t *pwVar8;
  int *piVar9;
  
  uVar6 = it->count;
  uVar7 = (ulong)(int)uVar6;
  if (uVar7 == 0) {
    pwVar4 = it->path[0].node;
    if (pwVar4 == (wtree_node_t *)0x0) {
      return (wtree_node_t *)0x0;
    }
    it->count = 1;
  }
  else {
    pwVar2 = it->path[uVar7 - 1].node;
    it->path[uVar7 - 1].dir = dir;
    if ((((dir & 1U) == 0) || (pwVar4 = (pwVar2->in_tree).rbn_left, pwVar4 == (wtree_node *)0x0)) &&
       (((dir & 2U) == 0 ||
        (pwVar4 = (wtree_node *)((ulong)(pwVar2->in_tree).rbn_right_red & 0xfffffffffffffffe),
        pwVar4 == (wtree_node_t *)0x0)))) {
      uVar5 = 1;
      if ((int)uVar6 < 1) {
        uVar5 = uVar6;
      }
      uVar5 = uVar5 - 1;
      piVar9 = &it->path[(ulong)uVar6 - 2].dir;
      do {
        pwVar8 = pwVar2;
        if ((int)uVar7 < 2) {
          it->count = uVar5;
          pwVar4 = pwVar8;
          uVar6 = uVar5;
          if (uVar5 == 0) {
            return (wtree_node_t *)0x0;
          }
          break;
        }
        pwVar2 = ((anon_struct_16_2_62ea00d6 *)(piVar9 + -2))->node;
        uVar6 = (int)uVar7 - 1;
        uVar7 = (ulong)uVar6;
        piVar1 = piVar9 + -4;
        iVar3 = *piVar9;
        piVar9 = piVar1;
      } while ((((iVar3 & 2) == 0) ||
               (pwVar4 = (wtree_node *)((ulong)(pwVar2->in_tree).rbn_right_red & 0xfffffffffffffffe)
               , pwVar4 == (wtree_node_t *)0x0)) || (pwVar8 == pwVar4));
    }
    it->count = uVar6 + 1;
    it->path[(int)uVar6].node = pwVar4;
  }
  *r_left = (pwVar4->in_tree).rbn_left;
  *r_right = (wtree_node_t *)((ulong)(pwVar4->in_tree).rbn_right_red & 0xfffffffffffffffe);
  return pwVar4;
}

Assistant:

static void
wtree_selfcheck(wtree_t *tree)
{
	wtree_node_t *node, *prev, *left, *right;

	/* Check node order. */
	struct wtree_iterator it;
	wtree_ifirst(tree, &it);
	prev = NULL;
	while ((node = wtree_inext(&it)) != NULL) {
		if (prev != NULL)
			fail_unless(prev->value <= node->value);
		prev = node;
	}

	/* Check node weights. */
	struct wtree_walk walk;
	wtree_walk_init(&walk, tree);
	while ((node = wtree_walk_next(&walk, RB_WALK_RIGHT | RB_WALK_LEFT,
				       &left, &right)) != NULL) {
		int left_weight = left != NULL ? left->weight : 0;
		int right_weight = right != NULL ? right->weight : 0;
		fail_unless(node->weight == left_weight + right_weight + 1);
	}
}